

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O1

int xercesc_4_0::XMLDateTime::compareOrder(XMLDateTime *lValue,XMLDateTime *rValue)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  XMLDateTime lTemp;
  XMLDateTime rTemp;
  XMLDateTime local_e0;
  XMLDateTime local_78;
  
  XMLDateTime(&local_e0,lValue);
  XMLDateTime(&local_78,rValue);
  normalize(&local_e0);
  normalize(&local_78);
  iVar1 = -1;
  bVar3 = false;
  if (local_78.fValue[0] <= local_e0.fValue[0]) {
    uVar2 = 0;
    do {
      if (local_78.fValue[0] < local_e0.fValue[0]) {
        iVar1 = 1;
        break;
      }
      bVar3 = 6 < uVar2;
      if (uVar2 == 7) break;
      local_e0.fValue[0] = local_e0.fValue[uVar2 + 1];
      local_78.fValue[0] = local_78.fValue[uVar2 + 1];
      uVar2 = uVar2 + 1;
    } while (local_78.fValue[0] <= local_e0.fValue[0]);
  }
  if ((bVar3) &&
     ((local_e0.fHasTime != true ||
      ((iVar1 = -1, local_78.fMilliSecond <= local_e0.fMilliSecond &&
       (iVar1 = 1, local_e0.fMilliSecond <= local_78.fMilliSecond)))))) {
    iVar1 = 0;
  }
  ~XMLDateTime(&local_78);
  ~XMLDateTime(&local_e0);
  return iVar1;
}

Assistant:

int XMLDateTime::compareOrder(const XMLDateTime* const lValue
                            , const XMLDateTime* const rValue)
                            //, MemoryManager* const memMgr)
{
    //
    // If any of the them is not normalized() yet,
    // we need to do something here.
    //
    XMLDateTime lTemp = *lValue;
    XMLDateTime rTemp = *rValue;

    lTemp.normalize();
    rTemp.normalize();

    for ( int i = 0 ; i < TOTAL_SIZE; i++ )
    {
        if ( lTemp.fValue[i] < rTemp.fValue[i] )
        {
            return LESS_THAN;
        }
        else if ( lTemp.fValue[i] > rTemp.fValue[i] )
        {
            return GREATER_THAN;
        }
    }

    if ( lTemp.fHasTime)
    {
        if ( lTemp.fMilliSecond < rTemp.fMilliSecond )
        {
            return LESS_THAN;
        }
        else if ( lTemp.fMilliSecond > rTemp.fMilliSecond )
        {
            return GREATER_THAN;
        }
    }

    return EQUAL;
}